

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O1

error_t ArgumentHandlers::RL_parse_argument(int key,char *arg,argp_state *state)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = state->input;
  if (key == 1) {
    iVar2 = atoi(arg);
    *(int *)((long)pvVar1 + 0x1c4) = iVar2;
  }
  else if (key == 0x65) {
    iVar2 = atoi(arg);
    *(int *)((long)pvVar1 + 0x1c0) = iVar2;
  }
  else {
    if (key != 0x6e) {
      return 7;
    }
    iVar2 = atoi(arg);
    *(int *)((long)pvVar1 + 0x1bc) = iVar2;
  }
  return 0;
}

Assistant:

error_t
RL_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
    case 'n':
        theArgumentsStruc->nrRLruns = atoi(arg);
        break;
    case 'e':
        theArgumentsStruc->nrIntermediateEvaluations = atoi(arg);
        break;
    case RLSTARTRUN:
        theArgumentsStruc->startAtRLrun = atoi(arg);
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}